

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_column_tests.h
# Opt level: O3

void column_test_row_access_constructors<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)6,true,true,true>>>,std::map<unsigned_int,boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)6,true,true,true>>>,boost::intrusive::constant_time_size<false>,boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)6,true,true,true>>::Matrix_row_tag>,boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>>>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)6,true,true,true>>>,boost::intrusive::constant_time_size<false>,boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)6,true,true,true>>::Matrix_row_tag>,boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>>>>>>>>
               (vector<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>_>_>
                *matrix,map<unsigned_int,_boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>_>_>_>
                        *rows)

{
  _Rb_tree_header *p_Var1;
  uint uVar2;
  int iVar3;
  _Base_ptr p_Var4;
  _Hash_node_base *p_Var5;
  _Hash_node_base *p_Var6;
  _Hash_node_base *p_Var7;
  Index IVar8;
  Index IVar9;
  ulong uVar10;
  bool bVar11;
  _Rb_tree_node_base *p_Var12;
  undefined4 local_2f4;
  undefined *local_2f0;
  undefined4 *local_2e8;
  undefined **local_2e0;
  undefined **local_2d8;
  ulong local_2d0;
  shared_count sStack_2c8;
  undefined4 **local_2c0;
  char *local_2b8;
  char *local_2b0;
  shared_count sStack_2a8;
  undefined **local_2a0;
  undefined1 local_298;
  undefined8 *local_290;
  undefined ***local_288;
  undefined4 **local_280;
  char *local_278;
  undefined **local_270;
  char *local_268;
  shared_count sStack_260;
  char *local_258;
  map<unsigned_int,_boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>_>_>_>
  *local_250;
  vector<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>_>_>
  *local_248;
  undefined1 local_240 [24];
  undefined4 ***local_228;
  _Hashtable<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>_*,_Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>_*>,_std::__detail::_Identity,_Gudhi::persistence_matrix::EntryPointerEq<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>_>,_Gudhi::persistence_matrix::EntryPointerHash<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_220;
  undefined4 local_1e8;
  undefined4 uStack_1e4;
  undefined4 uStack_1e0;
  undefined4 uStack_1dc;
  undefined1 *local_1d8;
  undefined1 *local_1d0;
  char *local_1c8;
  char *local_1c0;
  undefined1 *local_1b8;
  undefined1 *local_1b0;
  char *local_1a8;
  char *local_1a0;
  undefined1 *local_198;
  undefined1 *local_190;
  char *local_188;
  char *local_180;
  undefined1 local_178 [16];
  pointer pvStack_168;
  Index local_160;
  _Hashtable<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>_*,_Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>_*>,_std::__detail::_Identity,_Gudhi::persistence_matrix::EntryPointerEq<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>_>,_Gudhi::persistence_matrix::EntryPointerHash<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_158;
  undefined8 local_120;
  undefined8 uStack_118;
  char *local_110;
  char *local_108;
  undefined1 *local_100;
  undefined1 *local_f8;
  char *local_f0;
  char *local_e8;
  undefined1 *local_e0;
  undefined1 *local_d8;
  char *local_d0;
  char *local_c8;
  undefined1 *local_c0;
  undefined1 *local_b8;
  char *local_b0;
  char *local_a8;
  char *local_a0;
  char *local_98;
  undefined1 *local_90;
  undefined1 *local_88;
  char *local_80;
  char *local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  char *local_60;
  char *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  char *local_40;
  char *local_38;
  
  build_rows<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)6,true,true,true>>>>
            ();
  get_ordered_rows<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)6,true,true,true>>>>
            ((vector<std::set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
              *)local_240,matrix);
  test_matrix_equality<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)6,true,true,true>>>>
            ((vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
              *)local_178,
             (vector<std::set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
              *)local_240);
  std::
  vector<std::set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  ::~vector((vector<std::set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
             *)local_240);
  std::
  vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  ::~vector((vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
             *)local_178);
  build_column_values<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)6,true,true,true>>>>
            ();
  get_ordered_column_contents<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)6,true,true,true>>>>
            ((vector<std::set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
              *)local_240,matrix);
  test_matrix_equality<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)6,true,true,true>>>>
            ((vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
              *)local_178,
             (vector<std::set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
              *)local_240);
  std::
  vector<std::set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  ::~vector((vector<std::set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
             *)local_240);
  std::
  vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  ::~vector((vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
             *)local_178);
  local_248 = matrix;
  Gudhi::persistence_matrix::
  Unordered_set_column<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)6,true,true,true>>>
  ::
  Unordered_set_column<std::map<unsigned_int,boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)6,true,true,true>>>,boost::intrusive::constant_time_size<false>,boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)6,true,true,true>>::Matrix_row_tag>,boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>>>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)6,true,true,true>>>,boost::intrusive::constant_time_size<false>,boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)6,true,true,true>>::Matrix_row_tag>,boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>>>>>>>>
            ((Unordered_set_column<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)6,true,true,true>>>
              *)local_178,
             (matrix->
             super__Vector_base<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start,6,rows,(Column_settings *)0x0);
  p_Var1 = &(rows->_M_t)._M_impl.super__Rb_tree_header;
  p_Var12 = (rows->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  local_250 = rows;
  IVar8 = local_178._0_4_;
  local_240._12_4_ = local_178._12_4_;
  IVar9 = local_160;
  while (local_178._12_4_ = local_240._12_4_, (_Rb_tree_header *)p_Var12 != p_Var1) {
    local_178._0_4_ = IVar8;
    local_160 = IVar9;
    if (p_Var12[1]._M_parent != (_Base_ptr)&p_Var12[1]._M_parent &&
        p_Var12[1]._M_parent != (_Base_ptr)0x0) {
      p_Var4 = p_Var12[1]._M_left;
      uVar2 = *(uint *)&p_Var4->_M_left;
      if ((uVar2 < 6) && ((0x2bU >> (uVar2 & 0x1f) & 1) != 0)) {
        local_188 = 
        "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
        ;
        local_180 = "";
        local_198 = &boost::unit_test::basic_cstring<char_const>::null;
        local_190 = &boost::unit_test::basic_cstring<char_const>::null;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_188,0x20d);
        local_2d0 = local_2d0 & 0xffffffffffffff00;
        local_2d8 = &PTR__lazy_ostream_001fb428;
        sStack_2c8.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
        local_2c0 = (undefined4 **)0x1c2304;
        iVar3 = *(int *)&p_Var4[-1]._M_right;
        local_2e8 = (undefined4 *)CONCAT44(local_2e8._4_4_,iVar3);
        local_2f0 = (undefined *)CONCAT44(local_2f0._4_4_,6);
        local_270 = (undefined **)CONCAT71(local_270._1_7_,iVar3 == 6);
        local_268 = (char *)0x0;
        sStack_260.pi_ = (sp_counted_base *)0x0;
        local_2b8 = 
        "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
        ;
        local_2b0 = "";
        local_280 = &local_2e8;
        local_240._8_4_ = local_240._8_4_ & 0xffffff00;
        local_240._0_8_ = &PTR__lazy_ostream_001fb8e8;
        local_240._16_8_ = &boost::unit_test::lazy_ostream::inst;
        local_228 = &local_280;
        local_2e0 = &local_2f0;
        local_298 = 0;
        local_2a0 = &PTR__lazy_ostream_001fb928;
        local_290 = &boost::unit_test::lazy_ostream::inst;
        local_288 = &local_2e0;
        boost::test_tools::tt_detail::report_assertion
                  (&local_270,&local_2d8,&local_2b8,0x20d,1,2,2,"entry.get_column_index()",local_240
                   ,"6",&local_2a0);
        boost::detail::shared_count::~shared_count(&sStack_260);
      }
    }
    p_Var12 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var12);
    IVar8 = local_178._0_4_;
    local_240._12_4_ = local_178._12_4_;
    IVar9 = local_160;
  }
  local_178._0_4_ = 0;
  local_240._4_4_ = (undefined4)((ulong)local_240._0_8_ >> 0x20);
  local_240._0_4_ = IVar8;
  pvStack_168 = (pointer)0xffffffffffffffff;
  local_160 = 0xffffffff;
  uVar10 = (ulong)local_228 >> 0x20;
  local_228 = (undefined4 ***)CONCAT44((int)uVar10,IVar9);
  local_240._8_4_ = local_178._8_4_;
  std::
  _Hashtable<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>_*,_Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>_*>,_std::__detail::_Identity,_Gudhi::persistence_matrix::EntryPointerEq<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>_>,_Gudhi::persistence_matrix::EntryPointerHash<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::_Hashtable(&local_220,&local_158,&local_158);
  local_1e8 = (undefined4)local_120;
  uStack_1e4 = local_120._4_4_;
  uStack_1e0 = (undefined4)uStack_118;
  uStack_1dc = uStack_118._4_4_;
  local_120 = (Field_operators *)0x0;
  uStack_118 = (Entry_constructor *)0x0;
  local_40 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_38 = "";
  local_50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_48 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_40,0x21c);
  local_268 = (char *)((ulong)local_268 & 0xffffffffffffff00);
  local_270 = &PTR__lazy_ostream_001fb428;
  sStack_260.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_258 = "";
  local_2e0 = &local_2f0;
  local_2f0 = (undefined *)local_220._M_element_count;
  local_2e8 = &local_2f4;
  local_2f4 = 4;
  local_2b0 = (char *)0x0;
  sStack_2a8.pi_ = (sp_counted_base *)0x0;
  local_280 = (undefined4 **)0x1c2a63;
  local_278 = "";
  local_288 = &local_2e0;
  local_298 = 0;
  local_2a0 = &PTR__lazy_ostream_001fb3e8;
  local_290 = &boost::unit_test::lazy_ostream::inst;
  local_2c0 = &local_2e8;
  local_2d0 = local_2d0 & 0xffffffffffffff00;
  local_2d8 = &PTR__lazy_ostream_001fb928;
  sStack_2c8.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_2b8._0_1_ = (undefined *)local_220._M_element_count == (undefined *)0x4;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_2a8);
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_58 = "";
  local_70 = &boost::unit_test::basic_cstring<char_const>::null;
  local_68 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_60,0x21d);
  local_268 = (char *)((ulong)local_268 & 0xffffffffffffff00);
  local_270 = &PTR__lazy_ostream_001fb428;
  sStack_260.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_258 = "";
  local_2f0 = (undefined *)local_158._M_element_count;
  local_2b8 = (char *)CONCAT71(local_2b8._1_7_,
                               (undefined *)local_158._M_element_count == (undefined *)0x0);
  local_2f4 = 0;
  local_2b0 = (char *)0x0;
  sStack_2a8.pi_ = (sp_counted_base *)0x0;
  local_280 = (undefined4 **)0x1c2a63;
  local_278 = "";
  local_2e0 = &local_2f0;
  local_298 = 0;
  local_2a0 = &PTR__lazy_ostream_001fb3e8;
  local_290 = &boost::unit_test::lazy_ostream::inst;
  local_288 = &local_2e0;
  local_2e8 = &local_2f4;
  local_2d0 = local_2d0 & 0xffffffffffffff00;
  local_2d8 = &PTR__lazy_ostream_001fb928;
  sStack_2c8.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_2c0 = &local_2e8;
  boost::test_tools::tt_detail::report_assertion
            (&local_2b8,&local_270,&local_280,0x21d,1,2,2,"col.size()",&local_2a0,"0",&local_2d8);
  boost::detail::shared_count::~shared_count(&sStack_2a8);
  local_80 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_78 = "";
  local_90 = &boost::unit_test::basic_cstring<char_const>::null;
  local_88 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_80,0x21e);
  bVar11 = Gudhi::persistence_matrix::operator==
                     ((local_248->
                      super__Vector_base<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start,
                      (Unordered_set_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>
                       *)local_240);
  local_2d8 = (undefined **)CONCAT71(local_2d8._1_7_,bVar11);
  local_2d0 = 0;
  sStack_2c8.pi_ = (sp_counted_base *)0x0;
  local_270 = (undefined **)0x1ccbc9;
  local_268 = "";
  local_298 = 0;
  local_2a0 = &PTR__lazy_ostream_001fb398;
  local_290 = &boost::unit_test::lazy_ostream::inst;
  local_a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_98 = "";
  local_288 = &local_270;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_2c8);
  for (p_Var12 = (local_250->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var12 != p_Var1;
      p_Var12 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var12)) {
    if (p_Var12[1]._M_parent != (_Base_ptr)&p_Var12[1]._M_parent &&
        p_Var12[1]._M_parent != (_Base_ptr)0x0) {
      p_Var4 = p_Var12[1]._M_left;
      uVar2 = *(uint *)&p_Var4->_M_left;
      if ((uVar2 < 6) && ((0x2bU >> (uVar2 & 0x1f) & 1) != 0)) {
        local_1a8 = 
        "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
        ;
        local_1a0 = "";
        local_1b8 = &boost::unit_test::basic_cstring<char_const>::null;
        local_1b0 = &boost::unit_test::basic_cstring<char_const>::null;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1a8,0x225,
                   &local_1b8);
        local_268 = (char *)((ulong)local_268 & 0xffffffffffffff00);
        local_270 = &PTR__lazy_ostream_001fb428;
        sStack_260.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
        local_258 = "";
        iVar3 = *(int *)&p_Var4[-1]._M_right;
        local_2f0 = (undefined *)CONCAT44(local_2f0._4_4_,iVar3);
        local_2f4 = 6;
        local_2b8 = (char *)CONCAT71(local_2b8._1_7_,iVar3 == 6);
        local_2b0 = (char *)0x0;
        sStack_2a8.pi_ = (sp_counted_base *)0x0;
        local_280 = (undefined4 **)0x1c2a63;
        local_278 = "";
        local_2e0 = &local_2f0;
        local_298 = 0;
        local_2a0 = &PTR__lazy_ostream_001fb8e8;
        local_290 = &boost::unit_test::lazy_ostream::inst;
        local_288 = &local_2e0;
        local_2e8 = &local_2f4;
        local_2d0 = local_2d0 & 0xffffffffffffff00;
        local_2d8 = &PTR__lazy_ostream_001fb928;
        sStack_2c8.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
        local_2c0 = &local_2e8;
        boost::test_tools::tt_detail::report_assertion
                  (&local_2b8,&local_270,&local_280,0x225,1,2,2,"entry.get_column_index()",
                   &local_2a0,"6",&local_2d8);
        boost::detail::shared_count::~shared_count(&sStack_2a8);
      }
    }
  }
  Gudhi::persistence_matrix::swap
            ((Unordered_set_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>
              *)local_178,
             (Unordered_set_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>
              *)local_240);
  local_b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_a8 = "";
  local_c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_b8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_b0,0x234);
  local_268 = (char *)((ulong)local_268 & 0xffffffffffffff00);
  local_270 = &PTR__lazy_ostream_001fb428;
  sStack_260.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_258 = "";
  local_2f0 = (undefined *)local_220._M_element_count;
  local_2f4 = 0;
  local_2b0 = (char *)0x0;
  sStack_2a8.pi_ = (sp_counted_base *)0x0;
  local_280 = (undefined4 **)0x1c2a63;
  local_278 = "";
  local_2e0 = &local_2f0;
  local_298 = 0;
  local_2a0 = &PTR__lazy_ostream_001fb3e8;
  local_290 = &boost::unit_test::lazy_ostream::inst;
  local_288 = &local_2e0;
  local_2e8 = &local_2f4;
  local_2d0 = local_2d0 & 0xffffffffffffff00;
  local_2d8 = &PTR__lazy_ostream_001fb928;
  sStack_2c8.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_2c0 = &local_2e8;
  local_2b8._0_1_ = (undefined *)local_220._M_element_count == (undefined *)0x0;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_2a8);
  local_d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_c8 = "";
  local_e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_d8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_d0,0x235);
  local_268 = (char *)((ulong)local_268 & 0xffffffffffffff00);
  local_270 = &PTR__lazy_ostream_001fb428;
  sStack_260.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_258 = "";
  local_2f0 = (undefined *)local_158._M_element_count;
  local_2b8 = (char *)CONCAT71(local_2b8._1_7_,
                               (undefined *)local_158._M_element_count == (undefined *)0x4);
  local_2f4 = 4;
  local_2b0 = (char *)0x0;
  sStack_2a8.pi_ = (sp_counted_base *)0x0;
  local_280 = (undefined4 **)0x1c2a63;
  local_278 = "";
  local_2e0 = &local_2f0;
  local_298 = 0;
  local_2a0 = &PTR__lazy_ostream_001fb3e8;
  local_290 = &boost::unit_test::lazy_ostream::inst;
  local_288 = &local_2e0;
  local_2e8 = &local_2f4;
  local_2d0 = local_2d0 & 0xffffffffffffff00;
  local_2d8 = &PTR__lazy_ostream_001fb928;
  sStack_2c8.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_2c0 = &local_2e8;
  boost::test_tools::tt_detail::report_assertion
            (&local_2b8,&local_270,&local_280,0x235,1,2,2,"col.size()",&local_2a0,"4",&local_2d8);
  boost::detail::shared_count::~shared_count(&sStack_2a8);
  local_f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_e8 = "";
  local_100 = &boost::unit_test::basic_cstring<char_const>::null;
  local_f8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_f0,0x236);
  bVar11 = Gudhi::persistence_matrix::operator==
                     ((local_248->
                      super__Vector_base<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start,
                      (Unordered_set_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>
                       *)local_178);
  local_2d8 = (undefined **)CONCAT71(local_2d8._1_7_,bVar11);
  local_2d0 = 0;
  sStack_2c8.pi_ = (sp_counted_base *)0x0;
  local_270 = (undefined **)0x1ccbde;
  local_268 = "";
  local_298 = 0;
  local_2a0 = &PTR__lazy_ostream_001fb398;
  local_290 = &boost::unit_test::lazy_ostream::inst;
  local_110 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_108 = "";
  local_288 = &local_270;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_2c8);
  p_Var12 = (local_250->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  while ((_Rb_tree_header *)p_Var12 != p_Var1) {
    if (p_Var12[1]._M_parent != (_Base_ptr)&p_Var12[1]._M_parent &&
        p_Var12[1]._M_parent != (_Base_ptr)0x0) {
      p_Var4 = p_Var12[1]._M_left;
      uVar2 = *(uint *)&p_Var4->_M_left;
      if ((uVar2 < 6) && ((0x2bU >> (uVar2 & 0x1f) & 1) != 0)) {
        local_1c8 = 
        "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
        ;
        local_1c0 = "";
        local_1d8 = &boost::unit_test::basic_cstring<char_const>::null;
        local_1d0 = &boost::unit_test::basic_cstring<char_const>::null;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1c8,0x23d,
                   &local_1d8);
        local_268 = (char *)((ulong)local_268 & 0xffffffffffffff00);
        local_270 = &PTR__lazy_ostream_001fb428;
        sStack_260.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
        local_258 = "";
        iVar3 = *(int *)&p_Var4[-1]._M_right;
        local_2f0 = (undefined *)CONCAT44(local_2f0._4_4_,iVar3);
        local_2f4 = 6;
        local_2b8 = (char *)CONCAT71(local_2b8._1_7_,iVar3 == 6);
        local_2b0 = (char *)0x0;
        sStack_2a8.pi_ = (sp_counted_base *)0x0;
        local_280 = (undefined4 **)0x1c2a63;
        local_278 = "";
        local_2e0 = &local_2f0;
        local_298 = 0;
        local_2a0 = &PTR__lazy_ostream_001fb8e8;
        local_290 = &boost::unit_test::lazy_ostream::inst;
        local_288 = &local_2e0;
        local_2e8 = &local_2f4;
        local_2d0 = local_2d0 & 0xffffffffffffff00;
        local_2d8 = &PTR__lazy_ostream_001fb928;
        sStack_2c8.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
        local_2c0 = &local_2e8;
        boost::test_tools::tt_detail::report_assertion
                  (&local_2b8,&local_270,&local_280,0x23d,1,2,2,"entry.get_column_index()",
                   &local_2a0,"6",&local_2d8);
        boost::detail::shared_count::~shared_count(&sStack_2a8);
      }
    }
    p_Var12 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var12);
  }
  for (; local_220._M_before_begin._M_nxt != (_Hash_node_base *)0x0;
      local_220._M_before_begin._M_nxt = (local_220._M_before_begin._M_nxt)->_M_nxt) {
    p_Var5 = local_220._M_before_begin._M_nxt[1]._M_nxt;
    if (((CONCAT44(local_240._12_4_,local_240._8_4_) != 0) || (p_Var5 != (_Hash_node_base *)0x0)) &&
       (p_Var6 = p_Var5[1]._M_nxt, p_Var6 != (_Hash_node_base *)0x0)) {
      p_Var7 = p_Var5[2]._M_nxt;
      p_Var7->_M_nxt = p_Var6;
      p_Var6[1]._M_nxt = p_Var7;
    }
    operator_delete(p_Var5,0x20);
  }
  std::
  _Hashtable<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>_*,_Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>_*>,_std::__detail::_Identity,_Gudhi::persistence_matrix::EntryPointerEq<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>_>,_Gudhi::persistence_matrix::EntryPointerHash<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&local_220);
  for (; local_158._M_before_begin._M_nxt != (_Hash_node_base *)0x0;
      local_158._M_before_begin._M_nxt = (local_158._M_before_begin._M_nxt)->_M_nxt) {
    p_Var5 = local_158._M_before_begin._M_nxt[1]._M_nxt;
    if (((CONCAT44(local_178._12_4_,local_178._8_4_) != 0) || (p_Var5 != (_Hash_node_base *)0x0)) &&
       (p_Var6 = p_Var5[1]._M_nxt, p_Var6 != (_Hash_node_base *)0x0)) {
      p_Var7 = p_Var5[2]._M_nxt;
      p_Var7->_M_nxt = p_Var6;
      p_Var6[1]._M_nxt = p_Var7;
    }
    operator_delete(p_Var5,0x20);
  }
  std::
  _Hashtable<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>_*,_Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>_*>,_std::__detail::_Identity,_Gudhi::persistence_matrix::EntryPointerEq<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>_>,_Gudhi::persistence_matrix::EntryPointerHash<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&local_158);
  return;
}

Assistant:

void column_test_row_access_constructors(std::vector<Column>& matrix, Row_container& rows) {
  test_matrix_equality<Column>(build_rows<Column>(), get_ordered_rows(matrix));
  test_matrix_equality<Column>(build_column_values<Column>(), get_ordered_column_contents(matrix));

  Column col(matrix[0], 6, &rows);
  for (auto& r : rows) {
    if constexpr (Column::Master::Option_list::has_removable_rows) {
      if (!r.second.empty()) {
        auto& entry = *r.second.rbegin();
        if (entry.get_row_index() == 0 || entry.get_row_index() == 1 || entry.get_row_index() == 3 ||
            entry.get_row_index() == 5) {
          BOOST_CHECK_EQUAL(entry.get_column_index(), 6);
        }
      }
    } else {
      if (!r.empty()) {
        auto& entry = *r.rbegin();
        if (entry.get_row_index() == 0 || entry.get_row_index() == 1 || entry.get_row_index() == 3 ||
            entry.get_row_index() == 5) {
          BOOST_CHECK_EQUAL(entry.get_column_index(), 6);
        }
      }
    }
  }

  Column moveCol(std::move(col));
  BOOST_CHECK_EQUAL(moveCol.size(), 4);
  BOOST_CHECK_EQUAL(col.size(), 0);
  BOOST_CHECK(matrix[0] == moveCol);
  for (auto& r : rows) {
    if constexpr (Column::Master::Option_list::has_removable_rows) {
      if (!r.second.empty()) {
        auto& entry = *r.second.rbegin();
        if (entry.get_row_index() == 0 || entry.get_row_index() == 1 || entry.get_row_index() == 3 ||
            entry.get_row_index() == 5) {
          BOOST_CHECK_EQUAL(entry.get_column_index(), 6);
        }
      }
    } else {
      if (!r.empty()) {
        auto& entry = *r.rbegin();
        if (entry.get_row_index() == 0 || entry.get_row_index() == 1 || entry.get_row_index() == 3 ||
            entry.get_row_index() == 5) {
          BOOST_CHECK_EQUAL(entry.get_column_index(), 6);
        }
      }
    }
  }

  swap(col, moveCol);
  BOOST_CHECK_EQUAL(moveCol.size(), 0);
  BOOST_CHECK_EQUAL(col.size(), 4);
  BOOST_CHECK(matrix[0] == col);
  for (auto& r : rows) {
    if constexpr (Column::Master::Option_list::has_removable_rows) {
      if (!r.second.empty()) {
        auto& entry = *r.second.rbegin();
        if (entry.get_row_index() == 0 || entry.get_row_index() == 1 || entry.get_row_index() == 3 ||
            entry.get_row_index() == 5) {
          BOOST_CHECK_EQUAL(entry.get_column_index(), 6);
        }
      }
    } else {
      if (!r.empty()) {
        auto& entry = *r.rbegin();
        if (entry.get_row_index() == 0 || entry.get_row_index() == 1 || entry.get_row_index() == 3 ||
            entry.get_row_index() == 5) {
          BOOST_CHECK_EQUAL(entry.get_column_index(), 6);
        }
      }
    }
  }
}